

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

int Cloud_SupportSize(CloudManager *dd,CloudNode *n)

{
  CloudNode *n_00;
  ulong uVar1;
  ulong uVar2;
  int *support;
  int iVar3;
  CloudNode *n_01;
  
  if ((dd->tUnique <= n) && (n < dd->tUnique + dd->nNodesAlloc)) {
    n_00 = (CloudNode *)calloc((long)dd->nVars,4);
    n_01 = n_00;
    cloudSupport((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_00,support);
    cloudClearMark((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_01);
    uVar2 = 0;
    uVar1 = (ulong)(uint)dd->nVars;
    if (dd->nVars < 1) {
      uVar1 = uVar2;
    }
    iVar3 = 0;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      iVar3 = iVar3 + (uint)((&n_00->s)[uVar2] == 1);
    }
    free(n_00);
    return iVar3;
  }
  __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                ,0x296,"int Cloud_SupportSize(CloudManager *, CloudNode *)");
}

Assistant:

int Cloud_SupportSize( CloudManager * dd, CloudNode * n )
{
    int * support, i, count;

    CLOUD_ASSERT(n);

    // allocate and initialize support array for cloudSupport
    support = ABC_CALLOC( int, dd->nVars );

    // compute support and clean up markers
    cloudSupport( dd, Cloud_Regular(n), support );
    cloudClearMark( dd, Cloud_Regular(n) );

    // count support variables
    count = 0;
    for ( i = 0; i < dd->nVars; i++ )
    {
        if ( support[i] == 1 )
            count++;
    }

    ABC_FREE( support );
    return count;
}